

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringNew *curr)

{
  Name breakTo;
  string_view string;
  pointer pLVar1;
  bool bVar2;
  element_type *peVar3;
  Literals *this_00;
  pointer pLVar4;
  pointer pLVar5;
  Literal *pLVar6;
  uint64_t uVar7;
  Literal local_358;
  string local_340 [8];
  string str;
  stringstream wtf16;
  ostream local_310 [380];
  uint local_194;
  Type TStack_190;
  uint32_t codePoint;
  Literal local_188;
  pointer local_170;
  size_t i;
  Literals contents;
  size_t endVal;
  size_t startVal;
  Literals *ptrDataValues;
  shared_ptr<wasm::GCData> ptrData;
  Flow end;
  Flow start;
  undefined1 local_68 [8];
  Flow ptr;
  StringNew *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->ref);
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else if (*(int *)(ptr.breakTo.super_IString.str._M_str + 0x10) == 1) {
    visit((Flow *)&end.breakTo.super_IString.str._M_str,this,
          *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x20));
    bVar2 = Flow::breaking((Flow *)&end.breakTo.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&end.breakTo.super_IString.str._M_str);
    }
    else {
      visit((Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,this,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x28))
      ;
      bVar2 = Flow::breaking((Flow *)&ptrData.
                                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
      if (bVar2) {
        Flow::Flow(__return_storage_ptr__,
                   (Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      }
      else {
        Flow::getSingleValue((Flow *)local_68);
        wasm::Literal::getGCData((Literal *)&ptrDataValues);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ptrDataValues);
        if (!bVar2) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ptrDataValues);
        this_00 = &peVar3->values;
        pLVar6 = Flow::getSingleValue((Flow *)&end.breakTo.super_IString.str._M_str);
        pLVar4 = (pointer)wasm::Literal::getUnsigned(pLVar6);
        pLVar6 = Flow::getSingleValue
                           ((Flow *)&ptrData.
                                     super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
        contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)wasm::Literal::getUnsigned(pLVar6);
        pLVar5 = (pointer)SmallVector<wasm::Literal,_1UL>::size
                                    (&this_00->super_SmallVector<wasm::Literal,_1UL>);
        pLVar1 = contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (((pLVar5 < pLVar4) ||
            (pLVar5 = (pointer)SmallVector<wasm::Literal,_1UL>::size
                                         (&this_00->super_SmallVector<wasm::Literal,_1UL>),
            pLVar5 < pLVar1)) ||
           (contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < pLVar4)) {
          (*this->_vptr_ExpressionRunner[2])(this,"array oob");
        }
        Literals::Literals((Literals *)&i);
        if (pLVar4 < contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) {
          SmallVector<wasm::Literal,_1UL>::reserve
                    ((SmallVector<wasm::Literal,_1UL> *)&i,
                     (long)contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage - (long)pLVar4);
          for (local_170 = pLVar4;
              local_170 <
              contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
              local_170 = (pointer)((long)&(local_170->field_0).func.super_IString.str._M_len + 1))
          {
            pLVar6 = SmallVector<wasm::Literal,_1UL>::operator[]
                               (&this_00->super_SmallVector<wasm::Literal,_1UL>,(size_t)local_170);
            SmallVector<wasm::Literal,_1UL>::push_back((SmallVector<wasm::Literal,_1UL> *)&i,pLVar6)
            ;
          }
        }
        TStack_190.id = *(uintptr_t *)(ptr.breakTo.super_IString.str._M_str + 8);
        makeGCData(&local_188,this,(Literals *)&i,TStack_190);
        Flow::Flow(__return_storage_ptr__,&local_188);
        wasm::Literal::~Literal(&local_188);
        Literals::~Literals((Literals *)&i);
        std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&ptrDataValues);
      }
      Flow::~Flow((Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    Flow::~Flow((Flow *)&end.breakTo.super_IString.str._M_str);
  }
  else if (*(int *)(ptr.breakTo.super_IString.str._M_str + 0x10) == 2) {
    pLVar6 = Flow::getSingleValue((Flow *)local_68);
    uVar7 = wasm::Literal::getUnsigned(pLVar6);
    local_194 = (uint)uVar7;
    if (0x10ffff < local_194) {
      (*this->_vptr_ExpressionRunner[2])(this,"invalid code point");
    }
    std::__cxx11::stringstream::stringstream((stringstream *)(str.field_2._M_local_buf + 8));
    String::writeWTF16CodePoint(local_310,local_194);
    std::__cxx11::stringstream::str();
    string = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_340);
    wasm::Literal::Literal(&local_358,string);
    Flow::Flow(__return_storage_ptr__,&local_358);
    wasm::Literal::~Literal(&local_358);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::stringstream::~stringstream((stringstream *)(str.field_2._M_local_buf + 8));
  }
  else {
    breakTo.super_IString.str._M_str = DAT_03194068;
    breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringNew(StringNew* curr) {
    Flow ptr = visit(curr->ref);
    if (ptr.breaking()) {
      return ptr;
    }
    switch (curr->op) {
      case StringNewWTF16Array: {
        Flow start = visit(curr->start);
        if (start.breaking()) {
          return start;
        }
        Flow end = visit(curr->end);
        if (end.breaking()) {
          return end;
        }
        auto ptrData = ptr.getSingleValue().getGCData();
        if (!ptrData) {
          trap("null ref");
        }
        const auto& ptrDataValues = ptrData->values;
        size_t startVal = start.getSingleValue().getUnsigned();
        size_t endVal = end.getSingleValue().getUnsigned();
        if (startVal > ptrDataValues.size() || endVal > ptrDataValues.size() ||
            endVal < startVal) {
          trap("array oob");
        }
        Literals contents;
        if (endVal > startVal) {
          contents.reserve(endVal - startVal);
          for (size_t i = startVal; i < endVal; i++) {
            contents.push_back(ptrDataValues[i]);
          }
        }
        return makeGCData(std::move(contents), curr->type);
      }
      case StringNewFromCodePoint: {
        uint32_t codePoint = ptr.getSingleValue().getUnsigned();
        if (codePoint > 0x10FFFF) {
          trap("invalid code point");
        }
        std::stringstream wtf16;
        String::writeWTF16CodePoint(wtf16, codePoint);
        std::string str = wtf16.str();
        return Literal(str);
      }
      default:
        // TODO: others
        return Flow(NONCONSTANT_FLOW);
    }
  }